

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
DoInitProperty<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout,Var instance)

{
  code *pcVar1;
  bool bVar2;
  PropertyId pid;
  undefined4 *puVar3;
  RecyclableObject *instance_00;
  InlineCache *local_30;
  InlineCache *inlineCache;
  
  local_30 = (InlineCache *)0x0;
  bVar2 = VarIs<Js::RecyclableObject>(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x131c,"(!TaggedNumber::Is(instance))",
                                "!TaggedNumber::Is(instance)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pid = FunctionBody::GetPropertyIdFromCacheId
                  (*(FunctionBody **)(this + 0x88),(uint)playout->inlineCacheIndex);
  instance_00 = UnsafeVarTo<Js::RecyclableObject>(instance);
  bVar2 = TrySetPropertyLocalFastPath<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
                    (this,playout,pid,instance_00,&local_30,PropertyOperation_None);
  if (!bVar2) {
    DoInitProperty_NoFastPath<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
              (this,playout,instance);
  }
  return;
}

Assistant:

void InterpreterStackFrame::DoInitProperty(unaligned T* playout, Var instance)
    {
        // Same fast path as in the backend.

        InlineCache *inlineCache = nullptr;

        Assert(!TaggedNumber::Is(instance));
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        if (TrySetPropertyLocalFastPath(playout, propertyId, UnsafeVarTo<RecyclableObject>(instance), inlineCache))
        {
            return;
        }

        DoInitProperty_NoFastPath(playout, instance);
    }